

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.cpp
# Opt level: O3

void * CorUnix::InternalRealloc(void *pvMemblock,size_t szSize)

{
  void *pvVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (szSize == 0) {
      if (pvMemblock != (void *)0x0) {
        free(pvMemblock);
      }
      pvVar1 = (void *)0x0;
    }
    else {
      pvVar1 = realloc(pvMemblock,szSize);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return pvVar1;
    }
  }
  abort();
}

Assistant:

void *
CorUnix::InternalRealloc(
    void* pvMemblock,
    size_t szSize
    )
{
    void *pvMem;

    PERF_ENTRY(InternalRealloc);
    ENTRY("realloc (memblock:%p size=%d)\n", pvMemblock, szSize);    
       
    if (szSize == 0)
    {
        // If pvMemblock is NULL, there's no reason to call free.
        if (pvMemblock != NULL)
        {
            InternalFree(pvMemblock);
        }
        pvMem = NULL;
    }
    else
    {
        pvMem = realloc(pvMemblock, szSize);
    }

    LOGEXIT("realloc returns void * %p\n", pvMem);
    PERF_EXIT(InternalRealloc);
    return pvMem;
}